

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex2-server.c
# Opt level: O0

strbuf * finalise_and_sign_exhash(ssh2_transport_state *s)

{
  ssh_key *key;
  strbuf *psVar1;
  ptrlen data;
  strbuf *sb;
  ssh2_transport_state *s_local;
  
  ssh2transport_finalise_exhash(s);
  psVar1 = strbuf_new();
  key = s->hkey;
  data = make_ptrlen(s->exchange_hash,s->kex_alg->hash->hlen);
  ssh_key_sign(key,data,s->hkflags,psVar1->binarysink_);
  return psVar1;
}

Assistant:

static strbuf *finalise_and_sign_exhash(struct ssh2_transport_state *s)
{
    strbuf *sb;
    ssh2transport_finalise_exhash(s);
    sb = strbuf_new();
    ssh_key_sign(
        s->hkey, make_ptrlen(s->exchange_hash, s->kex_alg->hash->hlen),
        s->hkflags, BinarySink_UPCAST(sb));
    return sb;
}